

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::validateBuiltinArgs
          (Interpreter *this,LocationRange *loc,string *name,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args,vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                *params)

{
  Type TVar1;
  pointer pVVar2;
  pointer pTVar3;
  pointer pVVar4;
  long *plVar5;
  RuntimeError *__return_storage_ptr__;
  size_t sVar6;
  long lVar7;
  size_type *psVar8;
  Type t;
  Type t_00;
  pointer pTVar9;
  char *pcVar10;
  long lVar11;
  stringstream ss;
  string local_200;
  LocationRange *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pVVar4 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pVVar2 - (long)pVVar4 >> 4;
  pTVar9 = (params->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != (long)(params->
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9 >> 2) {
LAB_00199818:
    local_1e0 = loc;
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator+(&local_1d8,"Builtin function ",name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    local_200._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_200._M_dataplus._M_p == psVar8) {
      local_200.field_2._M_allocated_capacity = *psVar8;
      local_200.field_2._8_8_ = plVar5[3];
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    }
    else {
      local_200.field_2._M_allocated_capacity = *psVar8;
    }
    local_200._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    pTVar9 = (params->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (params->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar9 != pTVar3) {
      pcVar10 = "";
      do {
        TVar1 = *pTVar9;
        sVar6 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar10,sVar6);
        (anonymous_namespace)::type_str_abi_cxx11_
                  (&local_200,(_anonymous_namespace_ *)(ulong)TVar1,t);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        pTVar9 = pTVar9 + 1;
        pcVar10 = ", ";
      } while (pTVar9 != pTVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,") but got (",0xb);
    pVVar4 = (args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pVVar2 = (args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar4 != pVVar2) {
      pcVar10 = "";
      do {
        TVar1 = pVVar4->t;
        sVar6 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar10,sVar6);
        (anonymous_namespace)::type_str_abi_cxx11_
                  (&local_200,(_anonymous_namespace_ *)(ulong)TVar1,t_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        pVVar4 = pVVar4 + 1;
        pcVar10 = ", ";
      } while (pVVar4 != pVVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
    __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(__return_storage_ptr__,&this->stack,local_1e0,&local_200);
    __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (pVVar2 != pVVar4) {
    lVar11 = 0;
    do {
      if (pVVar4->t != pTVar9[lVar11]) goto LAB_00199818;
      lVar11 = lVar11 + 1;
      pVVar4 = pVVar4 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar11);
  }
  return;
}

Assistant:

void validateBuiltinArgs(const LocationRange &loc, const std::string &name,
                             const std::vector<Value> &args, const std::vector<Value::Type> params)
    {
        if (args.size() == params.size()) {
            for (std::size_t i = 0; i < args.size(); ++i) {
                if (args[i].t != params[i])
                    goto bad;
            }
            return;
        }
    bad:;
        std::stringstream ss;
        ss << "Builtin function " + name + " expected (";
        const char *prefix = "";
        for (auto p : params) {
            ss << prefix << type_str(p);
            prefix = ", ";
        }
        ss << ") but got (";
        prefix = "";
        for (auto a : args) {
            ss << prefix << type_str(a);
            prefix = ", ";
        }
        ss << ")";
        throw makeError(loc, ss.str());
    }